

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zDec.c
# Opt level: O3

SRes SzAr_DecodeFolder(CSzAr *p,UInt32 folderIndex,ILookInStream *inStream,UInt64 startPos,
                      Byte *outBuffer,size_t outSize,ISzAlloc *allocMain)

{
  size_t *psVar1;
  byte bVar2;
  Byte BVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  Byte *pBVar7;
  UInt64 *pUVar8;
  UInt64 *pUVar9;
  UInt64 UVar10;
  SRes SVar11;
  Bool_conflict BVar12;
  UInt32 UVar13;
  UInt64 UVar14;
  ulong uVar15;
  CPpmd7_Context *pCVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  _func_UInt32_void_ptr_UInt32 *p_Var21;
  UInt64 inSize;
  _func_UInt32_void_ptr_UInt32 *p_Var22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  SizeT inProcessed;
  CSzFolder folder;
  CSzData sd;
  CPpmd7 ppmd;
  Byte *local_4cd8;
  _func_UInt32_void_ptr_UInt32 *local_4cc8;
  int local_4cb8;
  ELzmaStatus local_4c94;
  CPpmd7_Context *local_4c90;
  undefined1 local_4c88 [16];
  Byte *local_4c78;
  _func_UInt32_void_ptr_UInt32 *local_4c68;
  UInt64 local_4c60;
  Byte *local_4c58;
  CPpmd7z_RangeDec local_4c50;
  CPpmd7_Context *local_4c28;
  _func_UInt32_void_ptr_UInt32 *local_4c20;
  IByteIn local_4c18;
  undefined1 local_4c10 [16];
  undefined1 local_4c00 [16];
  undefined8 local_4bf0;
  ILookInStream *local_4be8;
  CSzFolder local_4be0;
  Byte *local_4b68;
  ulong local_4b60;
  undefined1 local_4b58 [16];
  long local_4b48 [2];
  CSzData local_4b38;
  undefined1 local_4b28 [16];
  undefined1 local_4b18 [16];
  _func_UInt32_void_ptr_UInt32 *local_4b08;
  Byte *local_4b00;
  _func_UInt32_void_ptr_UInt32 *local_4af8;
  _func_UInt32_void_ptr_UInt32 *local_4af0;
  Byte *local_4ae8;
  Byte *local_4ae0;
  uint local_4ad8;
  UInt32 local_4ac8;
  
  sVar6 = p->FoCodersOffsets[folderIndex];
  pBVar7 = p->CodersData;
  local_4b38.Size = p->FoCodersOffsets[folderIndex + 1] - sVar6;
  local_4b38.Data = pBVar7 + sVar6;
  SVar11 = SzGetNextFolderItem(&local_4be0,&local_4b38);
  if (SVar11 != 0) {
    return SVar11;
  }
  if (local_4b38.Size != 0) {
    return 0xb;
  }
  if (local_4be0.UnpackStream != p->FoToMainUnpackSizeIndex[folderIndex]) {
    return 0xb;
  }
  local_4c60 = startPos;
  local_4c58 = pBVar7 + sVar6;
  UVar14 = SzAr_GetFolderUnpackSize(p,folderIndex);
  if (UVar14 != outSize) {
    return 0xb;
  }
  local_4c88 = (undefined1  [16])0x0;
  local_4c78 = (Byte *)0x0;
  uVar4 = p->FoToCoderUnpackSizes[folderIndex];
  pUVar8 = p->CoderUnpackSizes;
  uVar5 = p->FoStartPackStreamIndex[folderIndex];
  pUVar9 = p->PackPositions;
  local_4b48[0] = 0;
  local_4b58 = (undefined1  [16])0x0;
  uVar15 = (ulong)local_4be0.NumCoders;
  local_4b60 = (ulong)folderIndex;
  if ((3 < local_4be0.NumCoders - 1) || (local_4be0.Coders[0].NumStreams != '\x01')) {
    iVar18 = 4;
    goto LAB_0073423c;
  }
  if ((int)local_4be0.Coders[0].MethodID < 0x30101) {
    if ((local_4be0.Coders[0].MethodID == 0) || (local_4be0.Coders[0].MethodID == 0x21)) {
LAB_00733523:
      if (local_4be0.NumCoders != 4) {
        if (local_4be0.NumCoders == 2) {
          if ((((local_4be0.Coders[1].NumStreams != '\x01') || (local_4be0.NumPackStreams != 1)) ||
              (local_4be0.PackStreams[0] != 0)) ||
             (((local_4be0.NumBonds != 1 || (local_4be0.Bonds[0].InIndex != 1)) ||
              (local_4be0.Bonds[0].OutIndex != 0)))) goto LAB_00734237;
          iVar18 = 4;
          if ((int)local_4be0.Coders[1].MethodID < 0x3030401) {
            if (((local_4be0.Coders[1].MethodID != 3) &&
                (local_4be0.Coders[1].MethodID != 0x3030103)) &&
               (local_4be0.Coders[1].MethodID != 0x3030205)) goto LAB_0073423c;
          }
          else if ((int)local_4be0.Coders[1].MethodID < 0x3030701) {
            if ((local_4be0.Coders[1].MethodID != 0x3030401) &&
               (local_4be0.Coders[1].MethodID != 0x3030501)) goto LAB_0073423c;
          }
          else if ((local_4be0.Coders[1].MethodID != 0x3030701) &&
                  (local_4be0.Coders[1].MethodID != 0x3030805)) goto LAB_0073423c;
        }
        else {
          if ((local_4be0.NumCoders != 1) || (local_4be0.NumPackStreams != 1)) goto LAB_00734237;
          iVar18 = 4;
          if ((local_4be0.PackStreams[0] != 0) || (local_4be0.NumBonds != 0)) goto LAB_0073423c;
        }
LAB_0073356d:
        local_4b68 = outBuffer + outSize;
        local_4cd8 = (Byte *)0x0;
        uVar19 = 0;
        local_4c20 = (_func_UInt32_void_ptr_UInt32 *)0x0;
        local_4c28 = (CPpmd7_Context *)0x0;
        do {
          psVar1 = &local_4be0.Coders[uVar19].PropsOffset;
          UVar13 = local_4be0.Coders[uVar19].MethodID;
          if ((int)UVar13 < 0x30101) {
            if ((UVar13 == 0) || (UVar13 == 0x21)) goto LAB_0073360e;
LAB_00733bb8:
            iVar18 = 4;
            if (uVar19 != 1) goto LAB_00734307;
            BVar3 = local_4be0.Coders[1].PropsSize;
            if (UVar13 == 3) {
              if (BVar3 != '\x01') goto LAB_00734307;
              Delta_Init(local_4b28);
              Delta_Decode(local_4b28,local_4c58[*psVar1] + 1,outBuffer,outSize);
            }
            else {
              if (BVar3 != '\0') goto LAB_00734307;
              if ((int)UVar13 < 0x3030501) {
                if (UVar13 == 0x3030103) {
                  local_4b28._0_8_ = local_4b28._0_8_ & 0xffffffff00000000;
                  x86_Convert(outBuffer,outSize,0,(UInt32 *)local_4b28,0);
                }
                else {
                  if (UVar13 != 0x3030205) {
                    if (UVar13 == 0x3030401) {
                      IA64_Convert(outBuffer,outSize,0,0);
                      goto LAB_00733fef;
                    }
                    goto LAB_00734307;
                  }
                  PPC_Convert(outBuffer,outSize,0,0);
                }
              }
              else if (UVar13 == 0x3030501) {
                ARM_Convert(outBuffer,outSize,0,0);
              }
              else if (UVar13 == 0x3030701) {
                ARMT_Convert(outBuffer,outSize,0,0);
              }
              else {
                if (UVar13 != 0x3030805) goto LAB_00734307;
                SPARC_Convert(outBuffer,outSize,0,0);
              }
            }
          }
          else {
            if (UVar13 == 0x30101) {
LAB_0073360e:
              uVar20 = 0;
              local_4cc8 = (_func_UInt32_void_ptr_UInt32 *)outSize;
              pCVar16 = (CPpmd7_Context *)outBuffer;
              if ((int)uVar15 == 4) {
                local_4cc8 = (_func_UInt32_void_ptr_UInt32 *)pUVar8[uVar4 + uVar19];
                uVar20 = *(uint *)(&DAT_007a0bd0 + uVar19 * 4);
                if (uVar19 < 2) {
                  pCVar16 = (CPpmd7_Context *)(*allocMain->Alloc)(allocMain,(size_t)local_4cc8);
                  if (local_4cc8 != (_func_UInt32_void_ptr_UInt32 *)0x0 &&
                      pCVar16 == (CPpmd7_Context *)0x0) {
                    iVar18 = 2;
                    goto LAB_00734307;
                  }
                  local_4cb8 = (int)uVar19;
                  uVar17 = (1 - local_4cb8) * 8;
                  *(CPpmd7_Context **)(local_4c88 + uVar17) = pCVar16;
                  *(_func_UInt32_void_ptr_UInt32 **)(local_4b58 + uVar17) = local_4cc8;
                }
                else {
                  if (uVar19 != 2) {
                    iVar18 = 4;
                    goto LAB_00734307;
                  }
                  if (outSize < local_4cc8) {
                    iVar18 = 5;
                    goto LAB_00734307;
                  }
                  local_4c28 = (CPpmd7_Context *)(outBuffer + (outSize - (long)local_4cc8));
                  pCVar16 = local_4c28;
                  local_4c20 = local_4cc8;
                }
              }
              local_4c90 = pCVar16;
              UVar14 = pUVar9[(ulong)uVar5 + (ulong)uVar20];
              UVar10 = pUVar9[(ulong)uVar5 + (ulong)(uVar20 + 1)];
              iVar18 = LookInStream_SeekTo(inStream,UVar14 + local_4c60);
              if (iVar18 != 0) goto LAB_00734307;
              p_Var22 = (_func_UInt32_void_ptr_UInt32 *)(UVar10 - UVar14);
              UVar13 = local_4be0.Coders[uVar19].MethodID;
              iVar18 = 4;
              if ((int)UVar13 < 0x30101) {
                if (UVar13 == 0) {
                  if (p_Var22 == local_4cc8) {
                    iVar18 = SzDecodeCopy((UInt64)local_4cc8,inStream,(Byte *)local_4c90);
                    if (iVar18 == 0) goto LAB_00733fef;
                  }
                  else {
                    iVar18 = 1;
                  }
                  goto LAB_00734307;
                }
                if (UVar13 != 0x21) goto LAB_00734307;
                local_4b18 = (undefined1  [16])0x0;
                if (local_4be0.Coders[uVar19].PropsSize == '\x01') {
                  iVar18 = Lzma2Dec_AllocateProbs
                                     ((CLzma2Dec *)local_4b28,local_4c58[*psVar1],allocMain);
                  if (iVar18 == 0) {
                    local_4b18._8_8_ = local_4c90;
                    local_4af0 = local_4cc8;
                    Lzma2Dec_Init((CLzma2Dec *)local_4b28);
                    local_4c50.p.GetThreshold = (_func_UInt32_void_ptr_UInt32 *)0x40000;
                    if (p_Var22 < (_func_UInt32_void_ptr_UInt32 *)0x40000) {
                      local_4c50.p.GetThreshold = p_Var22;
                    }
                    while( true ) {
                      local_4c18.Read = (_func_Byte_void_ptr *)0x0;
                      iVar18 = (*inStream->Look)(inStream,&local_4c18.Read,(size_t *)&local_4c50);
                      p_Var21 = local_4af8;
                      if (iVar18 != 0) goto LAB_00734163;
                      local_4c68 = local_4c50.p.GetThreshold;
                      iVar18 = Lzma2Dec_DecodeToDic
                                         ((CLzma2Dec *)local_4b28,(SizeT)local_4cc8,
                                          (Byte *)local_4c18.Read,(SizeT *)&local_4c68,
                                          LZMA_FINISH_END,&local_4c94);
                      local_4c50.p.GetThreshold = local_4c50.p.GetThreshold + -(long)local_4c68;
                      if (iVar18 != 0) goto LAB_00734163;
                      p_Var22 = p_Var22 + -(long)local_4c68;
                      if (local_4c94 == LZMA_STATUS_FINISHED_WITH_MARK) break;
                      if ((local_4c68 == (_func_UInt32_void_ptr_UInt32 *)0x0) &&
                         (p_Var21 == local_4af8)) goto LAB_0073415e;
                      iVar18 = (*inStream->Skip)(inStream,(size_t)local_4c68);
                      if (iVar18 != 0) goto LAB_00734163;
                      local_4c50.p.GetThreshold = (_func_UInt32_void_ptr_UInt32 *)0x40000;
                      if (p_Var22 < (_func_UInt32_void_ptr_UInt32 *)0x40000) {
                        local_4c50.p.GetThreshold = p_Var22;
                      }
                    }
LAB_00733e74:
                    p_Var21 = local_4af8;
                    LzmaDec_FreeProbs((CLzmaDec *)local_4b28,allocMain);
                    iVar18 = 1;
                    if ((p_Var21 == local_4cc8) && (p_Var22 == (_func_UInt32_void_ptr_UInt32 *)0x0))
                    goto LAB_00733fef;
                    goto LAB_00734307;
                  }
                }
                else {
                  iVar18 = 1;
                }
              }
              else if (UVar13 == 0x30101) {
                local_4b18 = (undefined1  [16])0x0;
                iVar18 = LzmaDec_AllocateProbs
                                   ((CLzmaDec *)local_4b28,local_4c58 + *psVar1,
                                    (uint)local_4be0.Coders[uVar19].PropsSize,allocMain);
                if (iVar18 == 0) {
                  local_4b18._8_8_ = local_4c90;
                  local_4af0 = local_4cc8;
                  LzmaDec_Init((CLzmaDec *)local_4b28);
                  local_4c50.p.GetThreshold = (_func_UInt32_void_ptr_UInt32 *)0x40000;
                  if (p_Var22 < (_func_UInt32_void_ptr_UInt32 *)0x40000) {
                    local_4c50.p.GetThreshold = p_Var22;
                  }
                  while( true ) {
                    local_4c18.Read = (_func_Byte_void_ptr *)0x0;
                    iVar18 = (*inStream->Look)(inStream,&local_4c18.Read,(size_t *)&local_4c50);
                    p_Var21 = local_4af8;
                    if (iVar18 != 0) goto LAB_00734163;
                    local_4c68 = local_4c50.p.GetThreshold;
                    iVar18 = LzmaDec_DecodeToDic((CLzmaDec *)local_4b28,(SizeT)local_4cc8,
                                                 (Byte *)local_4c18.Read,(SizeT *)&local_4c68,
                                                 LZMA_FINISH_END,&local_4c94);
                    local_4c50.p.GetThreshold = local_4c50.p.GetThreshold + -(long)local_4c68;
                    if (iVar18 != 0) goto LAB_00734163;
                    p_Var22 = p_Var22 + -(long)local_4c68;
                    if (local_4c94 == LZMA_STATUS_FINISHED_WITH_MARK) goto LAB_00733e74;
                    if (((local_4c94 == LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK) &&
                        (local_4af8 == local_4cc8)) &&
                       (p_Var22 == (_func_UInt32_void_ptr_UInt32 *)0x0)) break;
                    if ((local_4c68 == (_func_UInt32_void_ptr_UInt32 *)0x0) &&
                       (p_Var21 == local_4af8)) goto LAB_0073415e;
                    iVar18 = (*inStream->Skip)(inStream,(size_t)local_4c68);
                    if (iVar18 != 0) goto LAB_00734163;
                    local_4c50.p.GetThreshold = (_func_UInt32_void_ptr_UInt32 *)0x40000;
                    if (p_Var22 < (_func_UInt32_void_ptr_UInt32 *)0x40000) {
                      local_4c50.p.GetThreshold = p_Var22;
                    }
                  }
                  LzmaDec_FreeProbs((CLzmaDec *)local_4b28,allocMain);
                  goto LAB_00733fef;
                }
              }
              else {
                if (UVar13 != 0x30401) goto LAB_00734307;
                local_4c18.Read = ReadByte;
                local_4c00 = (undefined1  [16])0x0;
                local_4c10 = (undefined1  [16])0x0;
                local_4bf0 = 0;
                iVar18 = 4;
                local_4be8 = inStream;
                if (((local_4be0.Coders[uVar19].PropsSize == '\x05') &&
                    (bVar2 = local_4c58[*psVar1], 0xc0 < (byte)(bVar2 + 0xbf))) &&
                   (UVar13 = *(UInt32 *)(local_4c58 + *psVar1 + 1), 0x823 < UVar13 + 0x24)) {
                  Ppmd7_Construct((CPpmd7 *)local_4b28);
                  BVar12 = Ppmd7_Alloc((CPpmd7 *)local_4b28,UVar13,allocMain);
                  if (BVar12 != 0) {
                    Ppmd7_Init((CPpmd7 *)local_4b28,(uint)bVar2);
                    Ppmd7z_RangeDec_CreateVTable(&local_4c50);
                    local_4c50.Stream = &local_4c18;
                    BVar12 = Ppmd7z_RangeDec_Init(&local_4c50);
                    if (BVar12 == 0) {
                      iVar18 = 1;
                    }
                    else {
                      if ((int)local_4bf0 == 0) {
                        p_Var21 = (_func_UInt32_void_ptr_UInt32 *)0x0;
                        if (local_4cc8 == (_func_UInt32_void_ptr_UInt32 *)0x0) {
LAB_00733ee4:
                          if (p_Var21 != local_4cc8) goto LAB_007342b8;
                        }
                        else {
                          do {
                            iVar18 = Ppmd7_DecodeSymbol((CPpmd7 *)local_4b28,&local_4c50.p);
                            if (((int)local_4bf0 != 0) || (iVar18 < 0)) goto LAB_00733ee4;
                            *(Byte *)((long)&local_4c90->NumStats + (long)p_Var21) = (Byte)iVar18;
                            p_Var21 = p_Var21 + 1;
                          } while (local_4cc8 != p_Var21);
                        }
                        uVar20 = local_4c50.Code;
                        p_Var21 = (_func_UInt32_void_ptr_UInt32 *)
                                  ((local_4c00._8_8_ + local_4c10._0_8_) - local_4c00._0_8_);
                        Ppmd7_Free((CPpmd7 *)local_4b28,allocMain);
                        iVar18 = 1;
                        if (p_Var21 == p_Var22) goto joined_r0x0073386d;
                        goto LAB_00734307;
                      }
LAB_007342b8:
                      iVar18 = local_4bf0._4_4_ + (uint)(local_4bf0._4_4_ == 0);
                    }
                    local_4c78 = local_4cd8;
                    Ppmd7_Free((CPpmd7 *)local_4b28,allocMain);
                    goto LAB_0073423c;
                  }
                  iVar18 = 2;
                }
              }
              local_4c78 = local_4cd8;
              goto LAB_0073423c;
            }
            if (UVar13 != 0x303011b) {
              if (UVar13 != 0x30401) goto LAB_00733bb8;
              goto LAB_0073360e;
            }
            if (uVar19 != 3) {
              iVar18 = 4;
              goto LAB_00734307;
            }
            UVar14 = pUVar9[(ulong)uVar5 + 1];
            UVar10 = pUVar9[(ulong)uVar5 + 2];
            inSize = UVar10 - UVar14;
            local_4cd8 = (Byte *)(*allocMain->Alloc)(allocMain,inSize);
            if (local_4cd8 == (Byte *)0x0 && UVar10 != UVar14) {
              iVar18 = 2;
              local_4cd8 = (Byte *)0x0;
              goto LAB_00734307;
            }
            iVar18 = LookInStream_SeekTo(inStream,UVar14 + local_4c60);
            if (iVar18 != 0) goto LAB_00734307;
            iVar18 = SzDecodeCopy(inSize,inStream,local_4cd8);
            if (iVar18 != 0) goto LAB_00734307;
            iVar18 = 1;
            if ((((local_4b58 & (undefined1  [16])0x3) != (undefined1  [16])0x0) ||
                ((local_4b58 & (undefined1  [16])0x3) != (undefined1  [16])0x0)) ||
               (local_4c20 + local_4b58._8_8_ + local_4b58._0_8_ !=
                (_func_UInt32_void_ptr_UInt32 *)outSize)) goto LAB_00734307;
            local_4b28._0_8_ = local_4c28;
            local_4b08 = (_func_UInt32_void_ptr_UInt32 *)
                         ((long)&local_4c28->NumStats + (long)local_4c20);
            local_4b28._8_8_ = local_4c88._0_8_;
            local_4b00 = (Byte *)((long)(UInt16 *)local_4c88._0_8_ + local_4b58._0_8_);
            local_4af8 = (_func_UInt32_void_ptr_UInt32 *)(local_4b58._8_8_ + local_4c88._8_8_);
            local_4b18._8_8_ = local_4cd8;
            local_4b18._0_8_ = local_4c88._8_8_;
            local_4af0 = (_func_UInt32_void_ptr_UInt32 *)(local_4cd8 + inSize);
            local_4ae0 = local_4b68;
            local_4ae8 = outBuffer;
            Bcj2Dec_Init((CBcj2Dec *)local_4b28);
            iVar18 = Bcj2Dec_Decode((CBcj2Dec *)local_4b28);
            if (iVar18 != 0) goto LAB_00734307;
            lVar23 = 4;
            do {
              iVar18 = 1;
              if (local_4b48[lVar23] != *(long *)(local_4b28 + lVar23 * 8)) goto LAB_00734307;
              lVar23 = lVar23 + 1;
            } while (lVar23 != 8);
            if ((local_4ac8 != 0) || (local_4ae8 != local_4ae0)) goto LAB_00734307;
            local_4ac8 = 0;
            uVar20 = local_4ad8;
joined_r0x0073386d:
            iVar18 = 1;
            if (uVar20 != 0) goto LAB_00734307;
          }
LAB_00733fef:
          uVar19 = uVar19 + 1;
          uVar15 = (ulong)local_4be0.NumCoders;
        } while (uVar19 < uVar15);
        iVar18 = 0;
LAB_00734307:
        local_4c78 = local_4cd8;
        goto LAB_0073423c;
      }
      if (local_4be0.Coders[1].NumStreams == '\x01') {
        if ((int)local_4be0.Coders[1].MethodID < 0x30101) {
          if ((local_4be0.Coders[1].MethodID == 0) || (local_4be0.Coders[1].MethodID == 0x21)) {
LAB_007340e4:
            if (local_4be0.Coders[2].NumStreams == '\x01') {
              if ((int)local_4be0.Coders[2].MethodID < 0x30101) {
                if ((local_4be0.Coders[2].MethodID == 0) || (local_4be0.Coders[2].MethodID == 0x21))
                {
LAB_0073419b:
                  if (local_4be0.Coders[3].MethodID == 0x303011b) {
                    auVar25._0_4_ = -(uint)(local_4be0.NumBonds == 3);
                    auVar25._4_4_ = -(uint)(local_4be0.Bonds[0].InIndex == 5);
                    auVar25._8_4_ = -(uint)(local_4be0.Bonds[0].OutIndex == 0);
                    auVar25._12_4_ = -(uint)(local_4be0.Bonds[1].InIndex == 4);
                    auVar24._0_4_ = -(uint)(local_4be0.PackStreams[0] == 2);
                    auVar24._4_4_ = -(uint)(local_4be0.PackStreams[1] == 6);
                    auVar24._8_4_ = -(uint)(local_4be0.PackStreams[2] == 1);
                    auVar24._12_4_ = -(uint)(local_4be0.PackStreams[3] == 0);
                    auVar24 = packssdw(auVar24,auVar25);
                    auVar24 = packsswb(auVar24,auVar24);
                    if (((((byte)(SUB161(auVar24 >> 7,0) & 1 | (SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                  (SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                  (SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                  (SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                  (SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                  (SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                 SUB161(auVar24 >> 0x3f,0) << 7) == 0xff) &&
                         (local_4be0.NumPackStreams == 4)) && (local_4be0.Bonds[1].OutIndex == 1))
                       && (local_4be0.Bonds[2].InIndex == 3)) {
                      iVar18 = 4;
                      if ((local_4be0.Bonds[2].OutIndex != 2) ||
                         (local_4be0.Coders[3].NumStreams != '\x04')) goto LAB_0073423c;
                      goto LAB_0073356d;
                    }
                  }
                }
              }
              else if ((local_4be0.Coders[2].MethodID == 0x30401) ||
                      (local_4be0.Coders[2].MethodID == 0x30101)) goto LAB_0073419b;
            }
          }
        }
        else if ((local_4be0.Coders[1].MethodID == 0x30401) ||
                (local_4be0.Coders[1].MethodID == 0x30101)) goto LAB_007340e4;
      }
    }
  }
  else if ((local_4be0.Coders[0].MethodID == 0x30401) || (local_4be0.Coders[0].MethodID == 0x30101))
  goto LAB_00733523;
LAB_00734237:
  iVar18 = 4;
LAB_0073423c:
  lVar23 = 0;
  do {
    (*allocMain->Free)(allocMain,*(void **)(local_4c88 + lVar23 * 8));
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  if (iVar18 == 0) {
    pBVar7 = (p->FolderCRCs).Defs;
    iVar18 = 0;
    if ((pBVar7 != (Byte *)0x0) &&
       ((char)(pBVar7[local_4b60 >> 3 & 0x1fffffff] << ((byte)local_4b60 & 7)) < '\0')) {
      UVar13 = CrcCalc(outBuffer,outSize);
      iVar18 = (uint)(UVar13 != (p->FolderCRCs).Vals[folderIndex]) * 3;
    }
  }
  return iVar18;
LAB_0073415e:
  iVar18 = 1;
LAB_00734163:
  local_4c78 = local_4cd8;
  LzmaDec_FreeProbs((CLzmaDec *)local_4b28,allocMain);
  goto LAB_0073423c;
}

Assistant:

SRes SzAr_DecodeFolder(const CSzAr *p, UInt32 folderIndex,
    ILookInStream *inStream, UInt64 startPos,
    Byte *outBuffer, size_t outSize,
    ISzAlloc *allocMain)
{
  SRes res;
  CSzFolder folder;
  CSzData sd;
  
  const Byte *data = p->CodersData + p->FoCodersOffsets[folderIndex];
  sd.Data = data;
  sd.Size = p->FoCodersOffsets[folderIndex + 1] - p->FoCodersOffsets[folderIndex];
  
  res = SzGetNextFolderItem(&folder, &sd);
  
  if (res != SZ_OK)
    return res;

  if (sd.Size != 0
      || folder.UnpackStream != p->FoToMainUnpackSizeIndex[folderIndex]
      || outSize != SzAr_GetFolderUnpackSize(p, folderIndex))
    return SZ_ERROR_FAIL;
  {
    unsigned i;
    Byte *tempBuf[3] = { 0, 0, 0};

    res = SzFolder_Decode2(&folder, data,
        &p->CoderUnpackSizes[p->FoToCoderUnpackSizes[folderIndex]],
        p->PackPositions + p->FoStartPackStreamIndex[folderIndex],
        inStream, startPos,
        outBuffer, (SizeT)outSize, allocMain, tempBuf);
    
    for (i = 0; i < 3; i++)
      IAlloc_Free(allocMain, tempBuf[i]);

    if (res == SZ_OK)
      if (SzBitWithVals_Check(&p->FolderCRCs, folderIndex))
        if (CrcCalc(outBuffer, outSize) != p->FolderCRCs.Vals[folderIndex])
          res = SZ_ERROR_CRC;

    return res;
  }
}